

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

int lgx_type_cmp(lgx_type_t *t1,lgx_type_t *t2)

{
  lgx_type_map_s *t1_00;
  lgx_type_map_s *t2_00;
  lgx_val_type_t lVar1;
  int iVar2;
  
  lVar1 = t1->type;
  if (lVar1 == t2->type) {
    do {
      if ((int)lVar1 < 8) {
        if (lVar1 != T_ARRAY) {
          if (lVar1 != T_UNKNOWN) {
            return 0;
          }
          return 1;
        }
        t1 = &((t1->u).arr)->value;
        t2 = &((t2->u).arr)->value;
      }
      else {
        if (lVar1 != T_MAP) {
          if (lVar1 != T_FUNCTION) {
            return 0;
          }
          iVar2 = lgx_type_cmp_function
                            ((lgx_type_function_t *)(t1->u).arr,(lgx_type_function_t *)(t2->u).arr);
          return iVar2;
        }
        t1_00 = (t1->u).map;
        t2_00 = (t2->u).map;
        iVar2 = lgx_type_cmp(&t1_00->key,&t2_00->key);
        if (iVar2 != 0) {
          return 1;
        }
        t1 = &t1_00->value;
        t2 = &t2_00->value;
      }
      lVar1 = ((lgx_type_t *)&t1->type)->type;
    } while (lVar1 == ((lgx_type_t *)&t2->type)->type);
  }
  return 1;
}

Assistant:

int lgx_type_cmp(lgx_type_t* t1, lgx_type_t* t2) {
    if (t1->type != t2->type) {
        return 1;
    }

    switch (t1->type) {
        case T_UNKNOWN:
            // unknown != unknown
            return 1;
        case T_ARRAY:
            return lgx_type_cmp(&t1->u.arr->value, &t2->u.arr->value);
        case T_MAP:
            if (lgx_type_cmp(&t1->u.map->key, &t2->u.map->key)) {
                return 1;
            }
            return lgx_type_cmp(&t1->u.map->value, &t2->u.map->value);
        case T_STRUCT:
            // TODO
            break;
        case T_INTERFACE:
            // TODO
            break;
        case T_FUNCTION:
            return lgx_type_cmp_function(t1->u.fun, t2->u.fun);
        default:
            break;
    }

    return 0;
}